

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::TestCaseTracking::TrackerBase::TrackerBase
          (TrackerBase *this,NameAndLocation *nameAndLocation,TrackerContext *ctx,ITracker *parent)

{
  ITracker *parent_local;
  TrackerContext *ctx_local;
  NameAndLocation *nameAndLocation_local;
  TrackerBase *this_local;
  
  ITracker::ITracker(&this->super_ITracker,nameAndLocation);
  (this->super_ITracker)._vptr_ITracker = (_func_int **)&PTR__TrackerBase_0047c1b0;
  this->m_ctx = ctx;
  this->m_parent = parent;
  clara::std::
  vector<std::shared_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<std::shared_ptr<Catch::TestCaseTracking::ITracker>_>_>
  ::vector(&this->m_children);
  this->m_runState = NotStarted;
  return;
}

Assistant:

TrackerBase::TrackerBase( NameAndLocation const& nameAndLocation, TrackerContext& ctx, ITracker* parent ):
        ITracker(nameAndLocation),
        m_ctx( ctx ),
        m_parent( parent )
    {}